

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world_region.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*>_>_>
* __thiscall
WorldRegion::item_sources_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*>_>_>
           *__return_storage_ptr__,WorldRegion *this)

{
  ItemSource *this_00;
  bool bVar1;
  reference ppWVar2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *this_01;
  reference ppIVar3;
  string *__k;
  mapped_type *ppIVar4;
  ItemSource *source;
  const_iterator __end2;
  const_iterator __begin2;
  vector<ItemSource_*,_std::allocator<ItemSource_*>_> *__range2;
  WorldNode *node;
  const_iterator __end1;
  const_iterator __begin1;
  vector<WorldNode_*,_std::allocator<WorldNode_*>_> *__range1;
  WorldRegion *this_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*>_>_>
  *item_sources;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*>_>_>
  ::map(__return_storage_ptr__);
  __end1 = std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::begin(&this->_nodes);
  node = (WorldNode *)std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>::end(&this->_nodes);
  while (bVar1 = __gnu_cxx::
                 operator==<WorldNode_*const_*,_std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>_>
                           (&__end1,(__normal_iterator<WorldNode_*const_*,_std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>_>
                                     *)&node), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppWVar2 = __gnu_cxx::
              __normal_iterator<WorldNode_*const_*,_std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>_>
              ::operator*(&__end1);
    this_01 = WorldNode::item_sources(*ppWVar2);
    __end2 = std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::begin(this_01);
    source = (ItemSource *)std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>::end(this_01);
    while (bVar1 = __gnu_cxx::
                   operator==<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                             (&__end2,(__normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                                       *)&source), ((bVar1 ^ 0xffU) & 1) != 0) {
      ppIVar3 = __gnu_cxx::
                __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
                ::operator*(&__end2);
      this_00 = *ppIVar3;
      __k = ItemSource::name_abi_cxx11_(this_00);
      ppIVar4 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ItemSource_*>_>_>
                ::operator[](__return_storage_ptr__,__k);
      *ppIVar4 = this_00;
      __gnu_cxx::
      __normal_iterator<ItemSource_*const_*,_std::vector<ItemSource_*,_std::allocator<ItemSource_*>_>_>
      ::operator++(&__end2);
    }
    __gnu_cxx::
    __normal_iterator<WorldNode_*const_*,_std::vector<WorldNode_*,_std::allocator<WorldNode_*>_>_>::
    operator++(&__end1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, ItemSource*> WorldRegion::item_sources() const
{
    std::map<std::string, ItemSource*> item_sources;
    for(WorldNode* node : _nodes)
    {
        for(ItemSource *source : node->item_sources())
            item_sources[source->name()] = source;
    }

    return item_sources;
}